

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.c
# Opt level: O0

double LZ77OptimalRun(ZopfliBlockState *s,uchar *in,size_t instart,size_t inend,
                     unsigned_short **path,size_t *pathsize,unsigned_short *length_array,
                     CostModelFun *costmodel,void *costcontext,ZopfliLZ77Store *store,ZopfliHash *h,
                     float *costs)

{
  size_t in_RDI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  unsigned_short *length_array_00;
  unsigned_short *unaff_retaddr;
  size_t in_stack_00000008;
  size_t in_stack_00000010;
  uchar *in_stack_00000018;
  double cost;
  void *in_stack_00000230;
  CostModelFun *in_stack_00000238;
  size_t in_stack_00000240;
  size_t in_stack_00000248;
  uchar *in_stack_00000250;
  ZopfliBlockState *in_stack_00000258;
  unsigned_short *in_stack_00000270;
  ZopfliHash *in_stack_00000278;
  float *in_stack_00000280;
  unsigned_short **pathsize_00;
  unsigned_short **in_stack_ffffffffffffffc0;
  
  pathsize_00 = path;
  length_array_00 =
       (unsigned_short *)
       GetBestLengths(in_stack_00000258,in_stack_00000250,in_stack_00000248,in_stack_00000240,
                      in_stack_00000238,in_stack_00000230,in_stack_00000270,in_stack_00000278,
                      in_stack_00000280);
  free((void *)*in_R8);
  *in_R8 = 0;
  *in_R9 = 0;
  TraceBackwards((size_t)in_R9,length_array_00,in_stack_ffffffffffffffc0,(size_t *)pathsize_00);
  FollowPath((ZopfliBlockState *)cost,in_stack_00000018,in_stack_00000010,in_stack_00000008,
             unaff_retaddr,in_RDI,(ZopfliLZ77Store *)path,(ZopfliHash *)inend);
  return (double)length_array_00;
}

Assistant:

static double LZ77OptimalRun(ZopfliBlockState* s,
    const unsigned char* in, size_t instart, size_t inend,
    unsigned short** path, size_t* pathsize,
    unsigned short* length_array, CostModelFun* costmodel,
    void* costcontext, ZopfliLZ77Store* store,
    ZopfliHash* h, float* costs) {
  double cost = GetBestLengths(s, in, instart, inend, costmodel,
                costcontext, length_array, h, costs);
  free(*path);
  *path = 0;
  *pathsize = 0;
  TraceBackwards(inend - instart, length_array, path, pathsize);
  FollowPath(s, in, instart, inend, *path, *pathsize, store, h);
  assert(cost < ZOPFLI_LARGE_FLOAT);
  return cost;
}